

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall pobr::utils::Logger::Exception::Exception(Exception *this,string *error)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__Exception_00116a18;
  (this->error)._M_dataplus._M_p = (pointer)&(this->error).field_2;
  pcVar1 = (error->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->error,pcVar1,pcVar1 + error->_M_string_length);
  return;
}

Assistant:

Exception::Exception(const std::string& error) noexcept:
error(error)
{}